

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverVector.h
# Opt level: O0

void Eigen::internal::triangular_solve_vector<float,_float,_long,_1,_2,_false,_0>::run
               (long size,float *_lhs,long lhsStride,float *rhs)

{
  long lVar1;
  long cols;
  bool bVar2;
  long *plVar3;
  Scalar *pSVar4;
  float *scalar;
  PointerArgType dataPtr;
  const_blas_data_mapper<float,_long,_0> local_2f8;
  const_blas_data_mapper<float,_long,_0> local_2e8;
  long local_2d8;
  long r;
  Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_2c8;
  ConstColXpr local_2b0;
  Type local_258;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>_>
  local_1d0;
  Index local_128;
  long s;
  long r_1;
  Index local_110;
  long i;
  long k;
  long endBlock;
  long startBlock;
  long local_e8;
  long actualPanelWidth;
  long pi;
  type cjLhs;
  undefined1 local_c0 [8];
  LhsMap lhs;
  float *rhs_local;
  long lhsStride_local;
  float *_lhs_local;
  long size_local;
  
  lhs.m_stride.super_Stride<_1,_0>._8_8_ = rhs;
  OuterStride<-1>::OuterStride((OuterStride<_1> *)&cjLhs,lhsStride);
  Map<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::Map
            ((Map<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
             local_c0,_lhs,size,size,(OuterStride<_1> *)&cjLhs);
  pi = (long)local_c0;
  for (actualPanelWidth = size; 0 < actualPanelWidth; actualPanelWidth = actualPanelWidth + -8) {
    startBlock = actualPanelWidth;
    plVar3 = std::min<long>(&startBlock,&run::PanelWidth);
    local_e8 = *plVar3;
    endBlock = actualPanelWidth - local_e8;
    k = 0;
    for (i = 0; cols = local_e8, lVar1 = endBlock, i < local_e8; i = i + 1) {
      local_110 = (actualPanelWidth - i) + -1;
      r_1._4_4_ = 0;
      bVar2 = numext::not_equal_strict<float,float>
                        ((float *)(lhs.m_stride.super_Stride<_1,_0>._8_8_ + local_110 * 4),
                         (float *)((long)&r_1 + 4));
      if (bVar2) {
        pSVar4 = MapBase<Eigen::Map<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
                 ::coeff((MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                          *)pi,local_110,local_110);
        *(float *)(lhs.m_stride.super_Stride<_1,_0>._8_8_ + local_110 * 4) =
             *(float *)(lhs.m_stride.super_Stride<_1,_0>._8_8_ + local_110 * 4) / *pSVar4;
        s = (local_e8 - i) + -1;
        local_128 = local_110 - s;
        if (0 < s) {
          scalar = (float *)(lhs.m_stride.super_Stride<_1,_0>._8_8_ + local_110 * 4);
          DenseBase<Eigen::Map<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>
          ::col(&local_2b0,
                (DenseBase<Eigen::Map<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 *)pi,local_110);
          DenseBase<Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>_>
          ::segment<long>(&local_258,
                          (DenseBase<Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>_>
                           *)&local_2b0,local_128,s);
          Eigen::operator*(&local_1d0,scalar,(StorageBaseType *)&local_258);
          lVar1 = s;
          dataPtr = (PointerArgType)(lhs.m_stride.super_Stride<_1,_0>._8_8_ + local_128 * 4);
          Stride<0,_0>::Stride((Stride<0,_0> *)((long)&r + 6));
          Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
                    (&local_2c8,dataPtr,lVar1,(Stride<0,_0> *)((long)&r + 6));
          MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator-=
                    ((MatrixBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
                      *)&local_2c8,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,__1,_1,_false>_>_>
                      *)&local_1d0);
        }
      }
    }
    local_2d8 = endBlock;
    if (0 < endBlock) {
      local_2e8.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data =
           MapBase<Eigen::Map<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
           ::coeffRef((MapBase<Eigen::Map<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                       *)local_c0,k,endBlock);
      local_2f8.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data =
           (float *)(lhs.m_stride.super_Stride<_1,_0>._8_8_ + endBlock * 4);
      local_2f8.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride = 1;
      local_2e8.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride = lhsStride;
      general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_0,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_false,_0>
      ::run(lVar1,cols,&local_2e8,&local_2f8,
            (ResScalar *)(lhs.m_stride.super_Stride<_1,_0>._8_8_ + k * 4),1,-1.0);
    }
  }
  return;
}

Assistant:

static void run(Index size, const LhsScalar* _lhs, Index lhsStride, RhsScalar* rhs)
  {
    typedef Map<const Matrix<LhsScalar,Dynamic,Dynamic,ColMajor>, 0, OuterStride<> > LhsMap;
    const LhsMap lhs(_lhs,size,size,OuterStride<>(lhsStride));
    typedef const_blas_data_mapper<LhsScalar,Index,ColMajor> LhsMapper;
    typedef const_blas_data_mapper<RhsScalar,Index,ColMajor> RhsMapper;
    typename internal::conditional<Conjugate,
                                   const CwiseUnaryOp<typename internal::scalar_conjugate_op<LhsScalar>,LhsMap>,
                                   const LhsMap&
                                  >::type cjLhs(lhs);
    static const Index PanelWidth = EIGEN_TUNE_TRIANGULAR_PANEL_WIDTH;

    for(Index pi=IsLower ? 0 : size;
        IsLower ? pi<size : pi>0;
        IsLower ? pi+=PanelWidth : pi-=PanelWidth)
    {
      Index actualPanelWidth = (std::min)(IsLower ? size - pi : pi, PanelWidth);
      Index startBlock = IsLower ? pi : pi-actualPanelWidth;
      Index endBlock = IsLower ? pi + actualPanelWidth : 0;

      for(Index k=0; k<actualPanelWidth; ++k)
      {
        Index i = IsLower ? pi+k : pi-k-1;
        if(numext::not_equal_strict(rhs[i],RhsScalar(0)))
        {
          if(!(Mode & UnitDiag))
            rhs[i] /= cjLhs.coeff(i,i);

          Index r = actualPanelWidth - k - 1; // remaining size
          Index s = IsLower ? i+1 : i-r;
          if (r>0)
            Map<Matrix<RhsScalar,Dynamic,1> >(rhs+s,r) -= rhs[i] * cjLhs.col(i).segment(s,r);
        }
      }
      Index r = IsLower ? size - endBlock : startBlock; // remaining size
      if (r > 0)
      {
        // let's directly call the low level product function because:
        // 1 - it is faster to compile
        // 2 - it is slightly faster at runtime
        general_matrix_vector_product<Index,LhsScalar,LhsMapper,ColMajor,Conjugate,RhsScalar,RhsMapper,false>::run(
            r, actualPanelWidth,
            LhsMapper(&lhs.coeffRef(endBlock,startBlock), lhsStride),
            RhsMapper(rhs+startBlock, 1),
            rhs+endBlock, 1, RhsScalar(-1));
      }
    }
  }